

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFUnit.cpp
# Opt level: O0

Error __thiscall llvm::DWARFUnit::tryExtractDIEsIfNeeded(DWARFUnit *this,bool CUDieOnly)

{
  undefined7 uVar1;
  bool bVar2;
  DwarfFormat Format;
  byte bVar3;
  uint16_t uVar4;
  int iVar5;
  size_type sVar6;
  reference D;
  unsigned_long *puVar7;
  uint64_t uVar8;
  DWARFObject *pDVar9;
  reference ptVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  size_t sVar11;
  reference y;
  DWARFListTableBase<llvm::DWARFDebugRnglist> *this_00;
  byte in_DL;
  Error *E;
  Error *E_00;
  undefined7 in_register_00000031;
  DWARFUnit *this_01;
  Optional<unsigned_long> OVar12;
  error_code EC;
  error_code EC_00;
  Error local_388;
  undefined1 local_380 [8];
  string local_378;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  Twine local_338;
  error_code local_320;
  undefined1 local_310 [8];
  Expected<llvm::DWARFDebugRnglistTable> TableOrError;
  DWARFDataExtractor RangesDA;
  undefined1 local_208 [8];
  string local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  Twine local_1c0;
  error_code local_1a8;
  undefined1 local_198 [8];
  Expected<llvm::Optional<llvm::StrOffsetsContributionDescriptor>_> StringOffsetOrError;
  DWARFDataExtractor DA;
  Optional<llvm::DWARFFormValue> local_110;
  Optional<llvm::DWARFFormValue> local_d8;
  Optional<llvm::DWARFFormValue> local_a0;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 local_68;
  Optional<unsigned_long> DWOId;
  DWARFDie UnitDie;
  Error local_40;
  byte local_35;
  bool HasCUDie;
  Error local_28;
  byte local_19;
  DWARFUnit *pDStack_18;
  bool CUDieOnly_local;
  DWARFUnit *this_local;
  
  this_01 = (DWARFUnit *)CONCAT71(in_register_00000031,CUDieOnly);
  local_19 = in_DL & 1;
  pDStack_18 = this_01;
  this_local = this;
  if (((local_19 == 0) ||
      (bVar2 = std::vector<llvm::DWARFDebugInfoEntry,_std::allocator<llvm::DWARFDebugInfoEntry>_>::
               empty(&this_01->DieArray), bVar2)) &&
     (sVar6 = std::vector<llvm::DWARFDebugInfoEntry,_std::allocator<llvm::DWARFDebugInfoEntry>_>::
              size(&this_01->DieArray), sVar6 < 2)) {
    bVar2 = std::vector<llvm::DWARFDebugInfoEntry,_std::allocator<llvm::DWARFDebugInfoEntry>_>::
            empty(&this_01->DieArray);
    local_35 = (bVar2 ^ 0xffU) & 1;
    extractDIEsToVector(this_01,(bool)((local_35 ^ 0xff) & 1),(bool)((local_19 ^ 0xff) & 1),
                        &this_01->DieArray);
    bVar2 = std::vector<llvm::DWARFDebugInfoEntry,_std::allocator<llvm::DWARFDebugInfoEntry>_>::
            empty(&this_01->DieArray);
    if (bVar2) {
      Error::success();
      Error::Error((Error *)this,&local_40);
      ErrorSuccess::~ErrorSuccess((ErrorSuccess *)&local_40);
    }
    else if ((local_35 & 1) == 0) {
      D = std::vector<llvm::DWARFDebugInfoEntry,_std::allocator<llvm::DWARFDebugInfoEntry>_>::
          operator[](&this_01->DieArray,0);
      DWARFDie::DWARFDie((DWARFDie *)&DWOId.Storage.hasVal,this_01,D);
      DWARFDie::find(&local_a0,(DWARFDie *)&DWOId.Storage.hasVal,DW_AT_GNU_dwo_id);
      OVar12 = dwarf::toUnsigned(&local_a0);
      local_68 = OVar12.Storage.field_0;
      DWOId.Storage.field_0.empty = OVar12.Storage.hasVal;
      bVar2 = llvm::Optional::operator_cast_to_bool((Optional *)&local_68.empty);
      if (bVar2) {
        puVar7 = Optional<unsigned_long>::operator*((Optional<unsigned_long> *)&local_68);
        DWARFUnitHeader::setDWOId(&this_01->Header,*puVar7);
      }
      if ((this_01->IsDWO & 1U) == 0) {
        if (this_01->AddrOffsetSectionBase != 0) {
          __assert_fail("AddrOffsetSectionBase == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/DWARFUnit.cpp"
                        ,0x1ae,"Error llvm::DWARFUnit::tryExtractDIEsIfNeeded(bool)");
        }
        if (this_01->RangeSectionBase != 0) {
          __assert_fail("RangeSectionBase == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/DWARFUnit.cpp"
                        ,0x1af,"Error llvm::DWARFUnit::tryExtractDIEsIfNeeded(bool)");
        }
        DWARFDie::find(&local_d8,(DWARFDie *)&DWOId.Storage.hasVal,DW_AT_addr_base);
        uVar8 = dwarf::toSectionOffset(&local_d8,0);
        this_01->AddrOffsetSectionBase = (uint32_t)uVar8;
        if (this_01->AddrOffsetSectionBase == 0) {
          DWARFDie::find(&local_110,(DWARFDie *)&DWOId.Storage.hasVal,DW_AT_GNU_addr_base);
          uVar8 = dwarf::toSectionOffset(&local_110,0);
          this_01->AddrOffsetSectionBase = (uint32_t)uVar8;
        }
        DWARFDie::find((Optional<llvm::DWARFFormValue> *)&DA.Section,
                       (DWARFDie *)&DWOId.Storage.hasVal,DW_AT_rnglists_base);
        uVar8 = dwarf::toSectionOffset((Optional<llvm::DWARFFormValue> *)&DA.Section,0);
        this_01->RangeSectionBase = uVar8;
      }
      pDVar9 = DWARFContext::getDWARFObj(this_01->Context);
      DWARFDataExtractor::DWARFDataExtractor
                ((DWARFDataExtractor *)&StringOffsetOrError.field_0x20,pDVar9,
                 this_01->StringOffsetSection,(bool)(this_01->isLittleEndian & 1),'\0');
      if (((this_01->IsDWO & 1U) != 0) || (uVar4 = getVersion(this_01), 4 < uVar4)) {
        if ((this_01->IsDWO & 1U) == 0) {
          determineStringOffsetsTableContribution
                    ((Expected<llvm::Optional<llvm::StrOffsetsContributionDescriptor>_> *)local_198,
                     this_01,(DWARFDataExtractor *)&StringOffsetOrError.field_0x20);
        }
        else {
          determineStringOffsetsTableContributionDWO
                    ((Expected<llvm::Optional<llvm::StrOffsetsContributionDescriptor>_> *)local_198,
                     this_01,(DWARFDataExtractor *)&StringOffsetOrError.field_0x20);
        }
        bVar2 = llvm::Expected::operator_cast_to_bool((Expected *)local_198);
        if (bVar2) {
          ptVar10 = Expected<llvm::Optional<llvm::StrOffsetsContributionDescriptor>_>::operator*
                              ((Expected<llvm::Optional<llvm::StrOffsetsContributionDescriptor>_> *)
                               local_198);
          (this_01->StringOffsetsTableContribution).Storage.field_0.value.Base =
               (ptVar10->Storage).field_0.value.Base;
          (this_01->StringOffsetsTableContribution).Storage.field_0.value.Size =
               (ptVar10->Storage).field_0.value.Size;
          *(undefined8 *)((long)&(this_01->StringOffsetsTableContribution).Storage.field_0 + 0x10) =
               *(undefined8 *)((long)&(ptVar10->Storage).field_0 + 0x10);
          uVar1 = *(undefined7 *)&(ptVar10->Storage).field_0x19;
          (this_01->StringOffsetsTableContribution).Storage.hasVal = (ptVar10->Storage).hasVal;
          *(undefined7 *)&(this_01->StringOffsetsTableContribution).Storage.field_0x19 = uVar1;
        }
        else {
          std::error_code::error_code<llvm::errc,void>(&local_1a8,invalid_argument);
          Expected<llvm::Optional<llvm::StrOffsetsContributionDescriptor>_>::takeError
                    ((Expected<llvm::Optional<llvm::StrOffsetsContributionDescriptor>_> *)local_208)
          ;
          toString_abi_cxx11_((string *)(local_208 + 8),(llvm *)local_208,E);
          std::operator+(&local_1e0,
                         "invalid reference to or invalid content in .debug_str_offsets[.dwo]: ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_208 + 8));
          Twine::Twine(&local_1c0,&local_1e0);
          EC._M_cat._0_4_ = local_1a8._M_value;
          EC._0_8_ = this;
          EC._M_cat._4_4_ = 0;
          createStringError(EC,(Twine *)local_1a8._M_cat);
          std::__cxx11::string::~string((string *)&local_1e0);
          std::__cxx11::string::~string((string *)(local_208 + 8));
          Error::~Error((Error *)local_208);
        }
        Expected<llvm::Optional<llvm::StrOffsetsContributionDescriptor>_>::~Expected
                  ((Expected<llvm::Optional<llvm::StrOffsetsContributionDescriptor>_> *)local_198);
        if (!bVar2) {
          return (Error)(ErrorInfoBase *)this;
        }
      }
      uVar4 = getVersion(this_01);
      if (4 < uVar4) {
        if ((this_01->IsDWO & 1U) == 0) {
          pDVar9 = DWARFContext::getDWARFObj(this_01->Context);
          iVar5 = (*pDVar9->_vptr_DWARFObject[0x13])();
          DWARFDie::find((Optional<llvm::DWARFFormValue> *)&RangesDA.Section,
                         (DWARFDie *)&DWOId.Storage.hasVal,DW_AT_rnglists_base);
          uVar8 = dwarf::toSectionOffset((Optional<llvm::DWARFFormValue> *)&RangesDA.Section,0);
          setRangesSection(this_01,(DWARFSection *)CONCAT44(extraout_var_00,iVar5),uVar8);
        }
        else {
          pDVar9 = DWARFContext::getDWARFObj(this_01->Context);
          iVar5 = (*pDVar9->_vptr_DWARFObject[0x22])();
          setRangesSection(this_01,(DWARFSection *)CONCAT44(extraout_var,iVar5),0);
        }
        sVar11 = StringRef::size(&this_01->RangeSection->Data);
        if (sVar11 != 0) {
          pDVar9 = DWARFContext::getDWARFObj(this_01->Context);
          DWARFDataExtractor::DWARFDataExtractor
                    ((DWARFDataExtractor *)&TableOrError.field_0x98,pDVar9,this_01->RangeSection,
                     (bool)(this_01->isLittleEndian & 1),'\0');
          uVar8 = this_01->RangeSectionBase;
          Format = DWARFUnitHeader::getFormat(&this_01->Header);
          parseRngListTableHeader
                    ((Expected<llvm::DWARFDebugRnglistTable> *)local_310,
                     (DWARFDataExtractor *)&TableOrError.field_0x98,uVar8,Format);
          bVar2 = llvm::Expected::operator_cast_to_bool((Expected *)local_310);
          if (bVar2) {
            y = Expected<llvm::DWARFDebugRnglistTable>::get
                          ((Expected<llvm::DWARFDebugRnglistTable> *)local_310);
            Optional<llvm::DWARFDebugRnglistTable>::operator=(&this_01->RngListTable,y);
            if (((this_01->IsDWO & 1U) != 0) &&
               (bVar2 = llvm::Optional::operator_cast_to_bool((Optional *)&this_01->RngListTable),
               bVar2)) {
              this_00 = &Optional<llvm::DWARFDebugRnglistTable>::operator->(&this_01->RngListTable)
                         ->super_DWARFListTableBase<llvm::DWARFDebugRnglist>;
              bVar3 = DWARFListTableBase<llvm::DWARFDebugRnglist>::getHeaderSize(this_00);
              this_01->RangeSectionBase = (ulong)bVar3;
            }
            bVar2 = false;
          }
          else {
            std::error_code::error_code<llvm::errc,void>(&local_320,invalid_argument);
            Expected<llvm::DWARFDebugRnglistTable>::takeError
                      ((Expected<llvm::DWARFDebugRnglistTable> *)local_380);
            toString_abi_cxx11_((string *)(local_380 + 8),(llvm *)local_380,E_00);
            std::operator+(&local_358,"parsing a range list table: ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (local_380 + 8));
            Twine::Twine(&local_338,&local_358);
            EC_00._M_cat._0_4_ = local_320._M_value;
            EC_00._0_8_ = this;
            EC_00._M_cat._4_4_ = 0;
            createStringError(EC_00,(Twine *)local_320._M_cat);
            std::__cxx11::string::~string((string *)&local_358);
            std::__cxx11::string::~string((string *)(local_380 + 8));
            Error::~Error((Error *)local_380);
            bVar2 = true;
          }
          Expected<llvm::DWARFDebugRnglistTable>::~Expected
                    ((Expected<llvm::DWARFDebugRnglistTable> *)local_310);
          if (bVar2) {
            return (Error)(ErrorInfoBase *)this;
          }
        }
      }
      Error::success();
      Error::Error((Error *)this,&local_388);
      ErrorSuccess::~ErrorSuccess((ErrorSuccess *)&local_388);
    }
    else {
      Error::success();
      Error::Error((Error *)this,(Error *)&UnitDie.Die);
      ErrorSuccess::~ErrorSuccess((ErrorSuccess *)&UnitDie.Die);
    }
  }
  else {
    Error::success();
    Error::Error((Error *)this,&local_28);
    ErrorSuccess::~ErrorSuccess((ErrorSuccess *)&local_28);
  }
  return (Error)(ErrorInfoBase *)this;
}

Assistant:

Error DWARFUnit::tryExtractDIEsIfNeeded(bool CUDieOnly) {
  if ((CUDieOnly && !DieArray.empty()) ||
      DieArray.size() > 1)
    return Error::success(); // Already parsed.

  bool HasCUDie = !DieArray.empty();
  extractDIEsToVector(!HasCUDie, !CUDieOnly, DieArray);

  if (DieArray.empty())
    return Error::success();

  // If CU DIE was just parsed, copy several attribute values from it.
  if (HasCUDie)
    return Error::success();

  DWARFDie UnitDie(this, &DieArray[0]);
  if (Optional<uint64_t> DWOId = toUnsigned(UnitDie.find(DW_AT_GNU_dwo_id)))
    Header.setDWOId(*DWOId);
  if (!IsDWO) {
    assert(AddrOffsetSectionBase == 0);
    assert(RangeSectionBase == 0);
    AddrOffsetSectionBase = toSectionOffset(UnitDie.find(DW_AT_addr_base), 0);
    if (!AddrOffsetSectionBase)
      AddrOffsetSectionBase =
          toSectionOffset(UnitDie.find(DW_AT_GNU_addr_base), 0);
    RangeSectionBase = toSectionOffset(UnitDie.find(DW_AT_rnglists_base), 0);
  }

  // In general, in DWARF v5 and beyond we derive the start of the unit's
  // contribution to the string offsets table from the unit DIE's
  // DW_AT_str_offsets_base attribute. Split DWARF units do not use this
  // attribute, so we assume that there is a contribution to the string
  // offsets table starting at offset 0 of the debug_str_offsets.dwo section.
  // In both cases we need to determine the format of the contribution,
  // which may differ from the unit's format.
  DWARFDataExtractor DA(Context.getDWARFObj(), StringOffsetSection,
                        isLittleEndian, 0);
  if (IsDWO || getVersion() >= 5) {
    auto StringOffsetOrError =
        IsDWO ? determineStringOffsetsTableContributionDWO(DA)
              : determineStringOffsetsTableContribution(DA);
    if (!StringOffsetOrError)
      return createStringError(errc::invalid_argument,
                               "invalid reference to or invalid content in "
                               ".debug_str_offsets[.dwo]: " +
                                   toString(StringOffsetOrError.takeError()));

    StringOffsetsTableContribution = *StringOffsetOrError;
  }

  // DWARF v5 uses the .debug_rnglists and .debug_rnglists.dwo sections to
  // describe address ranges.
  if (getVersion() >= 5) {
    if (IsDWO)
      setRangesSection(&Context.getDWARFObj().getRnglistsDWOSection(), 0);
    else
      setRangesSection(&Context.getDWARFObj().getRnglistsSection(),
                       toSectionOffset(UnitDie.find(DW_AT_rnglists_base), 0));
    if (RangeSection->Data.size()) {
      // Parse the range list table header. Individual range lists are
      // extracted lazily.
      DWARFDataExtractor RangesDA(Context.getDWARFObj(), *RangeSection,
                                  isLittleEndian, 0);
      auto TableOrError = parseRngListTableHeader(RangesDA, RangeSectionBase,
                                                  Header.getFormat());
      if (!TableOrError)
        return createStringError(errc::invalid_argument,
                                 "parsing a range list table: " +
                                     toString(TableOrError.takeError()));

      RngListTable = TableOrError.get();

      // In a split dwarf unit, there is no DW_AT_rnglists_base attribute.
      // Adjust RangeSectionBase to point past the table header.
      if (IsDWO && RngListTable)
        RangeSectionBase = RngListTable->getHeaderSize();
    }
  }

  // Don't fall back to DW_AT_GNU_ranges_base: it should be ignored for
  // skeleton CU DIE, so that DWARF users not aware of it are not broken.
  return Error::success();
}